

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrMesh.cpp
# Opt level: O3

bool __thiscall amrex::AmrMesh::LevelDefined(AmrMesh *this,int lev)

{
  long *plVar1;
  
  if ((lev <= (this->super_AmrInfo).max_level) &&
     (plVar1 = *(long **)&(this->grids).
                          super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                          super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                          _M_impl.super__Vector_impl_data._M_start[lev].m_ref.
                          super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>,
     *plVar1 != plVar1[1])) {
    plVar1 = *(long **)&(this->dmap).
                        super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                        .
                        super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                        ._M_impl.super__Vector_impl_data._M_start[lev].m_ref.
                        super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
    ;
    return *plVar1 != plVar1[1];
  }
  return false;
}

Assistant:

bool
AmrMesh::LevelDefined (int lev) noexcept
{
    return lev <= max_level && !grids[lev].empty() && !dmap[lev].empty();
}